

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O3

HighsInt Highs_changeColsIntegralityByMask(void *highs,HighsInt *mask,HighsInt *integrality)

{
  HighsInt iCol;
  HighsStatus HVar1;
  size_type sVar2;
  size_type __new_size;
  vector<HighsVarType,_std::allocator<HighsVarType>_> pass_integrality;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_38;
  
  __new_size = (size_type)*(int *)((long)highs + 0x138);
  local_38.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
  super__Vector_impl_data._M_start = (HighsVarType *)0x0;
  local_38.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (long)__new_size) {
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize(&local_38,__new_size);
    sVar2 = 0;
    do {
      local_38.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start[sVar2] = *(HighsVarType *)(integrality + sVar2);
      sVar2 = sVar2 + 1;
    } while (__new_size != sVar2);
  }
  HVar1 = Highs::changeColsIntegrality
                    ((Highs *)highs,mask,
                     local_38.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (local_38.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start != (HighsVarType *)0x0) {
    operator_delete(local_38.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return HVar1;
}

Assistant:

HighsInt Highs_changeColsIntegralityByMask(void* highs, const HighsInt* mask,
                                           const HighsInt* integrality) {
  const HighsInt num__col = Highs_getNumCol(highs);
  vector<HighsVarType> pass_integrality;
  if (num__col > 0) {
    pass_integrality.resize(num__col);
    for (HighsInt iCol = 0; iCol < num__col; iCol++) {
      pass_integrality[iCol] = (HighsVarType)integrality[iCol];
    }
  }
  return (HighsInt)((Highs*)highs)
      ->changeColsIntegrality(mask, pass_integrality.data());
}